

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImGuiWindow **ppIVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  double dVar6;
  bool bVar7;
  short sVar8;
  int iVar9;
  ImGuiWindow *pIVar10;
  ImGuiContext *pIVar11;
  ImGuiWindow *pIVar12;
  undefined1 uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ImGuiWindow *pIVar17;
  ImGuiContext *g;
  byte bVar18;
  byte bVar19;
  ImGuiWindow *pIVar20;
  ImGuiWindow *pIVar21;
  char cVar22;
  int iVar23;
  char cVar24;
  byte bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  
  pIVar11 = GImGui;
  IVar5 = (GImGui->Style).TouchExtraPadding;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = IVar5.x;
  auVar27._4_4_ = IVar5.y;
  auVar27 = maxps(auVar27,_DAT_0025ada0);
  GImGui->WindowsHoverPadding = auVar27._0_8_;
  pIVar12 = pIVar11->MovingWindow;
  pIVar17 = (ImGuiWindow *)0x0;
  if ((pIVar12 != (ImGuiWindow *)0x0) && ((pIVar12->Flags & 0x200) == 0)) {
    pIVar17 = pIVar12;
  }
  lVar15 = (long)(pIVar11->Windows).Size;
  if (lVar15 < 1) {
    pIVar20 = (ImGuiWindow *)0x0;
  }
  else {
    bVar26 = (pIVar11->IO).ConfigWindowsResizeFromEdges;
    uVar16 = lVar15 + 1;
    pIVar20 = (ImGuiWindow *)0x0;
    do {
      pIVar10 = (pIVar11->Windows).Data[uVar16 - 2];
      if (((pIVar10->Active == true) && (pIVar10->Hidden == false)) &&
         (uVar14 = pIVar10->Flags, (uVar14 >> 9 & 1) == 0)) {
        fVar28 = auVar27._0_4_;
        if ((bVar26 & 1U) == 0) {
          fVar28 = IVar5.x;
        }
        if ((uVar14 & 0x1000042) != 0) {
          fVar28 = IVar5.x;
        }
        fVar3 = (pIVar11->IO).MousePos.x;
        if ((pIVar10->OuterRectClipped).Min.x - fVar28 <= fVar3) {
          fVar29 = auVar27._4_4_;
          if ((bVar26 & 1U) == 0) {
            fVar29 = IVar5.y;
          }
          if ((uVar14 & 0x1000042) != 0) {
            fVar29 = IVar5.y;
          }
          fVar4 = (pIVar11->IO).MousePos.y;
          if (((((pIVar10->OuterRectClipped).Min.y - fVar29 <= fVar4) &&
               (fVar3 < fVar28 + (pIVar10->OuterRectClipped).Max.x)) &&
              (fVar4 < fVar29 + (pIVar10->OuterRectClipped).Max.y)) &&
             (((sVar8 = (pIVar10->HitTestHoleSize).x, sVar8 == 0 ||
               (fVar28 = (float)(int)(pIVar10->HitTestHoleOffset).x + (pIVar10->Pos).x,
               fVar3 < fVar28)) ||
              ((fVar28 + (float)(int)sVar8 <= fVar3 ||
               ((fVar28 = (float)(int)(pIVar10->HitTestHoleOffset).y + (pIVar10->Pos).y,
                fVar4 < fVar28 || (fVar28 + (float)(int)(pIVar10->HitTestHoleSize).y <= fVar4)))))))
             ) {
            if (pIVar17 == (ImGuiWindow *)0x0) {
              pIVar17 = pIVar10;
            }
            pIVar21 = pIVar10;
            if (pIVar20 != (ImGuiWindow *)0x0) {
              pIVar21 = pIVar20;
            }
            if (((pIVar12 == (ImGuiWindow *)0x0) || (pIVar20 != (ImGuiWindow *)0x0)) ||
               (pIVar21 = pIVar10, pIVar10->RootWindow != pIVar12->RootWindow)) {
              pIVar20 = pIVar21;
              if (pIVar17 != (ImGuiWindow *)0x0) break;
              pIVar17 = (ImGuiWindow *)0x0;
            }
            else {
              pIVar20 = (ImGuiWindow *)0x0;
            }
          }
        }
      }
      uVar16 = uVar16 - 1;
    } while (1 < uVar16);
  }
  pIVar11->HoveredWindow = pIVar17;
  pIVar11->HoveredWindowUnderMovingWindow = pIVar20;
  pIVar12 = GetTopMostPopupModal();
  bVar26 = false;
  if ((pIVar12 != (ImGuiWindow *)0x0) && (bVar26 = false, pIVar17 != (ImGuiWindow *)0x0)) {
    pIVar17 = pIVar17->RootWindow;
    if (pIVar17->RootWindow == pIVar12) {
      bVar26 = false;
    }
    else {
      do {
        bVar26 = pIVar17 != pIVar12;
        if (pIVar17 == pIVar12) break;
        pIVar17 = pIVar17->ParentWindowInBeginStack;
      } while (pIVar17 != (ImGuiWindow *)0x0);
    }
  }
  ppIVar1 = &pIVar11->HoveredWindow;
  uVar14 = (pIVar11->IO).ConfigFlags;
  iVar9 = (pIVar11->OpenPopupStack).Size;
  iVar23 = -1;
  lVar15 = 0;
  bVar19 = 0;
  do {
    if ((pIVar11->IO).MouseClicked[lVar15] == true) {
      (pIVar11->IO).MouseDownOwned[lVar15] =
           pIVar11->HoveredWindow != (ImGuiWindow *)0x0 || 0 < iVar9;
      (pIVar11->IO).MouseDownOwnedUnlessPopupClose[lVar15] =
           pIVar11->HoveredWindow != (ImGuiWindow *)0x0 || pIVar12 != (ImGuiWindow *)0x0;
    }
    bVar7 = (pIVar11->IO).MouseDown[lVar15];
    if ((bVar7 == true) &&
       ((iVar23 == -1 ||
        (dVar6 = (pIVar11->IO).MouseClickedTime[iVar23],
        pdVar2 = (pIVar11->IO).MouseClickedTime + lVar15, *pdVar2 <= dVar6 && dVar6 != *pdVar2)))) {
      iVar23 = (int)lVar15;
    }
    bVar19 = bVar19 & 1 | bVar7;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 5);
  bVar25 = 1;
  cVar24 = '\x01';
  cVar22 = '\x01';
  if (iVar23 != -1) {
    cVar24 = (pIVar11->IO).MouseDownOwned[iVar23];
    cVar22 = (pIVar11->IO).MouseDownOwnedUnlessPopupClose[iVar23];
  }
  bVar18 = (byte)((uVar14 & 0x10) >> 4) | bVar26;
  if (pIVar11->DragDropActive == true) {
    bVar25 = (pIVar11->DragDropSourceFlags & 0x10U) == 0 | bVar18;
  }
  if (cVar24 != '\0') {
    bVar25 = bVar18;
  }
  if (bVar25 != 0) {
    *ppIVar1 = (ImGuiWindow *)0x0;
    pIVar11->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  iVar23 = pIVar11->WantCaptureMouseNextFrame;
  if (iVar23 == -1) {
    if ((cVar24 == '\0') || ((bVar26 = true, *ppIVar1 == (ImGuiWindow *)0x0 && (bVar19 == 0)))) {
      bVar26 = 0 < iVar9;
    }
    (pIVar11->IO).WantCaptureMouse = bVar26;
    if ((cVar22 == '\0') || ((bVar26 = true, *ppIVar1 == (ImGuiWindow *)0x0 && (bVar19 == 0)))) {
      bVar26 = pIVar12 != (ImGuiWindow *)0x0;
    }
    (pIVar11->IO).WantCaptureMouseUnlessPopupClose = bVar26;
  }
  else {
    (pIVar11->IO).WantCaptureMouseUnlessPopupClose = iVar23 != 0;
    (pIVar11->IO).WantCaptureMouse = iVar23 != 0;
  }
  if (pIVar11->WantCaptureKeyboardNextFrame == -1) {
    bVar26 = pIVar11->ActiveId != 0 || pIVar12 != (ImGuiWindow *)0x0;
  }
  else {
    bVar26 = pIVar11->WantCaptureKeyboardNextFrame != 0;
  }
  uVar14 = uVar14 & 9;
  uVar13 = (char)uVar14;
  if (uVar14 != 1) {
    uVar13 = bVar26;
  }
  if ((pIVar11->IO).NavActive == false) {
    uVar13 = bVar26;
  }
  (pIVar11->IO).WantCaptureKeyboard = (bool)uVar13;
  (pIVar11->IO).WantTextInput = pIVar11->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}